

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<MyPairIndex>::~cbtAlignedObjectArray(cbtAlignedObjectArray<MyPairIndex> *this)

{
  clear(this);
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}